

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form1_Split(SplitForm1 Split)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  code *in_RDI;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  output;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  uint32_t in_stack_fffffffffffffedc;
  uint8_t value;
  Image *in_stack_fffffffffffffee0;
  Image *image;
  undefined8 in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  undefined8 in_stack_fffffffffffffef8;
  uint8_t value_00;
  size_type __n;
  bool local_f1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff28;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *this;
  undefined8 in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  Image *in_stack_ffffffffffffff40;
  uint32_t in_stack_ffffffffffffff74;
  uint32_t in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff7c;
  ImageTemplate<unsigned_char> local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  code *local_8;
  
  value_00 = (uint8_t)((ulong)in_stack_fffffffffffffef8 >> 0x38);
  local_8 = in_RDI;
  Unit_Test::intensityArray(in_stack_fffffffffffffedc);
  value = (uint8_t)(in_stack_fffffffffffffedc >> 0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,0);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
             (uint32_t)((ulong)in_stack_fffffffffffffee8 >> 0x20),
             (uint32_t)in_stack_fffffffffffffee8,(uint8_t)((ulong)in_stack_fffffffffffffee0 >> 0x38)
             ,(uint8_t)((ulong)in_stack_fffffffffffffee0 >> 0x30));
  Test_Helper::uniformRGBImage
            (value_00,(Image *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e2c39);
  PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_48);
  PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_48);
  Unit_Test::fillImage
            (in_stack_ffffffffffffff40,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff38,
             (uint32_t)((ulong)in_stack_ffffffffffffff30 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_48);
  PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_48);
  Test_Helper::uniformImages
            (in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
  this = (vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
          *)&stack0xffffffffffffff68;
  pvVar2 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this,0);
  pvVar3 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this,1);
  pvVar4 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this,2);
  (*local_8)(&local_48,pvVar2,pvVar3,pvVar4);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                *)&stack0xffffffffffffff68,0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,0);
  bVar1 = Unit_Test::verifyImage(in_stack_fffffffffffffee0,value);
  local_f1 = false;
  if (bVar1) {
    __n = 1;
    std::
    vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
    ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                  *)&stack0xffffffffffffff68,1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,__n);
    bVar1 = Unit_Test::verifyImage(in_stack_fffffffffffffee0,value);
    local_f1 = false;
    if (bVar1) {
      image = (Image *)0x2;
      std::
      vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
      ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                    *)&stack0xffffffffffffff68,2);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                (&local_20,(size_type)image);
      in_stack_fffffffffffffef7 = Unit_Test::verifyImage(image,value);
      local_f1 = (bool)in_stack_fffffffffffffef7;
    }
  }
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e2e41);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  return (bool)(local_f1 & 1);
}

Assistant:

bool form1_Split(SplitForm1 Split)
    {
        const std::vector < uint8_t > intensity = intensityArray( 3 );
        PenguinV_Image::Image input = uniformRGBImage( intensity[0] );
        fillImage( input, 0, 0, input.width(), input.height(), intensity );

        std::vector < PenguinV_Image::Image > output = uniformImages( 3, input.width(), input.height() );
        Split( input, output[0], output[1], output[2] );

        return verifyImage( output[0], intensity[0] ) && verifyImage( output[1], intensity[1] ) && verifyImage( output[2], intensity[2] );
    }